

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_compress_block(cram_fd *fd,cram_block *b,cram_metrics *metrics,int method,int level)

{
  pthread_mutex_t *__mutex;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  FILE *__stream;
  size_t sVar5;
  int iVar6;
  uchar *puVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  pthread_mutex_t *__mutex_00;
  cram_block_method method_00;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  undefined8 uVar20;
  double dVar21;
  double dVar23;
  double dVar24;
  double dVar25;
  uchar *local_98;
  ulong local_90;
  cram_block_method local_84;
  size_t comp_size;
  ulong local_78;
  pthread_mutex_t *local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  cram_fd *local_38;
  int iVar22;
  
  comp_size = 0;
  iVar22 = b->uncomp_size;
  if (level == 0 || method == 0) {
LAB_001250b0:
    b->method = RAW;
    b->comp_size = iVar22;
    return 0;
  }
  if (iVar22 == 0) {
    iVar22 = 0;
    goto LAB_001250b0;
  }
  if (metrics == (cram_metrics *)0x0) {
    method_00 = GZIP;
    puVar7 = (uchar *)cram_compress_by_method((char *)b->data,(long)iVar22,&comp_size,GZIP,level,1);
    if (puVar7 == (uchar *)0x0) {
      fwrite("Compression failed!\n",0x14,1,_stderr);
      return -1;
    }
    free(b->data);
    b->data = puVar7;
    b->comp_size = (int32_t)comp_size;
    b->method = GZIP;
    goto LAB_00125777;
  }
  __mutex = &fd->metrics_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((metrics->trial < 1) &&
     (iVar22 = metrics->next_trial, metrics->next_trial = iVar22 + -1, 1 < iVar22)) {
    method_00 = metrics->method;
    iVar22 = metrics->strat;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    puVar7 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&comp_size,method_00,level,
                                 iVar22);
    if (puVar7 == (uchar *)0x0) {
      return -1;
    }
    free(b->data);
    b->data = puVar7;
    b->comp_size = (int32_t)comp_size;
    b->method = method_00;
    goto LAB_00125777;
  }
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_68 = 0;
  uVar16 = metrics->revised_method;
  if (metrics->revised_method == 0) {
    metrics->revised_method = method;
    uVar16 = method;
  }
  if (metrics->next_trial == 0) {
    metrics->trial = 3;
    metrics->next_trial = 0x32;
    metrics->sz_gz_rle = metrics->sz_gz_rle / 2;
    metrics->sz_gz_def = metrics->sz_gz_def / 2;
    metrics->sz_rans0 = metrics->sz_rans0 / 2;
    metrics->sz_rans1 = metrics->sz_rans1 / 2;
    uVar1 = metrics->sz_bzip2;
    uVar3 = metrics->sz_lzma;
    metrics->sz_bzip2 = (int)uVar1 / 2;
    metrics->sz_lzma = (int)uVar3 / 2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  local_90 = 0x7fffffff;
  local_38 = fd;
  if ((uVar16 >> 0xb & 1) == 0) {
    local_98 = (uchar *)0x0;
    local_84 = RAW;
    local_40 = 0;
  }
  else {
    local_98 = (uchar *)cram_compress_by_method
                                  ((char *)b->data,(long)b->uncomp_size,&local_50,GZIP,1,3);
    local_40 = local_50;
    if (local_98 == (uchar *)0x0) {
      local_40 = (long)b->uncomp_size * 2 + 1000;
    }
    else {
      if (local_50 < 0x7fffffff) {
        local_84 = GZIP_RLE;
        local_90 = local_50;
        goto LAB_001251ce;
      }
      free(local_98);
    }
    local_98 = (uchar *)0x0;
    local_84 = RAW;
  }
LAB_001251ce:
  local_70 = (pthread_mutex_t *)__mutex;
  if ((uVar16 & 2) == 0) {
    local_78 = 0;
  }
  else {
    puVar7 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_58,GZIP,level,1);
    sVar5 = local_58;
    if (puVar7 == (uchar *)0x0) {
      local_78 = (long)b->uncomp_size * 2 + 1000;
    }
    else {
      local_78 = local_58;
      if (local_58 < local_90) {
        free(local_98);
        local_90 = sVar5;
        local_84 = GZIP;
        local_98 = puVar7;
      }
      else {
        free(puVar7);
      }
    }
  }
  if ((uVar16 & 0x10) == 0) {
    uVar17 = 0;
  }
  else {
    puVar7 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_60,RANS,0,0);
    uVar17 = local_60;
    if (puVar7 == (uchar *)0x0) {
      uVar17 = (long)b->uncomp_size * 2 + 1000;
    }
    else if (local_60 < local_90) {
      free(local_98);
      local_84 = RANS;
      local_90 = uVar17;
      local_98 = puVar7;
    }
    else {
      free(puVar7);
    }
  }
  iVar22 = 0;
  local_48 = uVar17;
  if ((uVar16 >> 10 & 1) == 0) {
    iVar18 = 0;
  }
  else {
    puVar7 = (uchar *)cram_compress_by_method
                                ((char *)b->data,(long)b->uncomp_size,&local_68,RANS1,0,0);
    uVar17 = local_68;
    if (puVar7 == (uchar *)0x0) {
      uVar17 = (long)b->uncomp_size * 2 + 1000;
    }
    else if (local_68 < local_90) {
      free(local_98);
      local_90 = uVar17;
      local_98 = puVar7;
      local_84 = RANS1;
    }
    else {
      free(puVar7);
    }
    iVar18 = (int)uVar17;
  }
  if ((uVar16 & 4) != 0) {
    iVar22 = b->uncomp_size * 2 + 1000;
  }
  iVar12 = 0;
  if ((uVar16 & 8) != 0) {
    iVar12 = b->uncomp_size * 2 + 1000;
  }
  free(b->data);
  __mutex_00 = local_70;
  b->data = local_98;
  if (local_84 == GZIP_RLE) {
    local_84 = GZIP;
  }
  b->method = local_84;
  b->comp_size = (int32_t)local_90;
  pthread_mutex_lock(local_70);
  fd = local_38;
  iVar6 = (int)local_40 + metrics->sz_gz_rle;
  metrics->sz_gz_rle = iVar6;
  iVar9 = (int)local_78 + metrics->sz_gz_def;
  metrics->sz_gz_def = iVar9;
  iVar11 = (int)local_48 + metrics->sz_rans0;
  metrics->sz_rans0 = iVar11;
  uVar2 = metrics->sz_rans1;
  uVar4 = metrics->sz_bzip2;
  iVar18 = iVar18 + uVar2;
  iVar22 = iVar22 + uVar4;
  uVar20 = CONCAT44(iVar22,iVar18);
  metrics->sz_rans1 = iVar18;
  metrics->sz_bzip2 = iVar22;
  iVar12 = iVar12 + metrics->sz_lzma;
  metrics->sz_lzma = iVar12;
  metrics->trial = metrics->trial + -1;
  if (metrics->trial == 0) {
    if (local_38->level < 4) {
      dVar21 = 1.02;
      dVar24 = 1.08;
      dVar23 = 1.1;
      dVar25 = 1.04;
LAB_00125447:
      iVar9 = (int)((double)iVar9 * dVar25);
      metrics->sz_gz_def = iVar9;
      uVar20 = CONCAT44((int)((double)iVar22 * dVar24),(int)((double)iVar18 * dVar21));
      metrics->sz_rans1 = (int)((double)iVar18 * dVar21);
      metrics->sz_bzip2 = (int)((double)iVar22 * dVar24);
      iVar12 = (int)((double)iVar12 * dVar23);
      metrics->sz_lzma = iVar12;
    }
    else if ((uint)local_38->level < 7) {
      dVar21 = 1.01;
      dVar24 = 1.03;
      dVar23 = 1.05;
      dVar25 = 1.02;
      goto LAB_00125447;
    }
    iVar22 = (int)uVar20;
    iVar18 = (int)((ulong)uVar20 >> 0x20);
    uVar13 = 0;
    if (iVar6 != 0x7fffffff) {
      uVar13 = 0xb;
    }
    uVar13 = uVar13 & (int)(uVar16 << 0x14) >> 0x1f;
    iVar15 = 0x7fffffff;
    if ((uVar16 >> 0xb & 1) != 0) {
      iVar15 = iVar6;
    }
    if ((uVar16 & 2) != 0) {
      if (iVar9 < iVar15) {
        uVar13 = 1;
      }
      if (iVar9 <= iVar15) {
        iVar15 = iVar9;
      }
    }
    uVar14 = uVar13;
    if (iVar11 < iVar15) {
      uVar14 = 4;
    }
    iVar10 = iVar11;
    if (iVar15 < iVar11) {
      iVar10 = iVar15;
    }
    bVar19 = (uVar16 & 0x10) == 0;
    if (bVar19) {
      uVar14 = uVar13;
    }
    if (bVar19) {
      iVar10 = iVar15;
    }
    if ((uVar16 >> 10 & 1) != 0) {
      if (iVar22 < iVar10) {
        uVar14 = 10;
      }
      if (iVar22 <= iVar10) {
        iVar10 = iVar22;
      }
    }
    if ((uVar16 & 4) != 0) {
      if (iVar18 < iVar10) {
        uVar14 = 2;
      }
      if (iVar18 <= iVar10) {
        iVar10 = iVar18;
      }
    }
    if (((uVar16 & 8) == 0) || (iVar10 <= iVar12)) {
      if (uVar14 != 0xb) goto LAB_0012554f;
      metrics->method = 1;
      metrics->strat = 3;
      metrics->gz_rle_cnt = 0;
      metrics->gz_rle_extra = 0.0;
      uVar14 = 0xb;
LAB_001255bc:
      if (((iVar10 < iVar9) &&
          (iVar6 = metrics->gz_def_cnt, metrics->gz_def_cnt = iVar6 + 1, 2 < iVar6)) &&
         (dVar21 = (double)iVar9 / (double)iVar10 + -1.0 + metrics->gz_def_extra,
         metrics->gz_def_extra = dVar21, 0.2 <= dVar21)) {
        uVar16 = uVar16 & 0xfffffffd;
      }
      if (uVar14 != 4) goto LAB_00125617;
      metrics->rans0_cnt = 0;
      metrics->rans0_extra = 0.0;
      uVar14 = 4;
LAB_0012566d:
      if (((iVar10 < iVar22) &&
          (iVar6 = metrics->rans1_cnt, metrics->rans1_cnt = iVar6 + 1, 2 < iVar6)) &&
         (dVar21 = (double)iVar22 / (double)iVar10 + -1.0 + metrics->rans1_extra,
         metrics->rans1_extra = dVar21, 0.2 <= dVar21)) {
        uVar16 = uVar16 & 0xfffffbff;
      }
      if (uVar14 != 2) goto LAB_001256ca;
      metrics->bzip2_cnt = 0;
      metrics->bzip2_extra = 0.0;
LAB_00125721:
      if (((iVar10 < iVar12) &&
          (iVar22 = metrics->lzma_cnt, metrics->lzma_cnt = iVar22 + 1, 2 < iVar22)) &&
         (dVar21 = (double)iVar12 / (double)iVar10 + -1.0 + metrics->lzma_extra,
         metrics->lzma_extra = dVar21, 0.2 <= dVar21)) {
        uVar16 = uVar16 & 0xfffffff7;
      }
    }
    else {
      uVar14 = 3;
      iVar10 = iVar12;
LAB_0012554f:
      metrics->method = uVar14;
      metrics->strat = 1;
      if (((iVar10 < iVar6) &&
          (iVar15 = metrics->gz_rle_cnt, metrics->gz_rle_cnt = iVar15 + 1, 2 < iVar15)) &&
         (dVar21 = (double)iVar6 / (double)iVar10 + -1.0 + metrics->gz_rle_extra,
         metrics->gz_rle_extra = dVar21, 0.2 <= dVar21)) {
        uVar16 = uVar16 & 0xfffff7ff;
      }
      if (uVar14 != 1) goto LAB_001255bc;
      metrics->gz_def_cnt = 0;
      metrics->gz_def_extra = 0.0;
      uVar14 = 1;
LAB_00125617:
      if (((iVar10 < iVar11) &&
          (iVar6 = metrics->rans0_cnt, metrics->rans0_cnt = iVar6 + 1, 2 < iVar6)) &&
         (dVar21 = (double)iVar11 / (double)iVar10 + -1.0 + metrics->rans0_extra,
         metrics->rans0_extra = dVar21, 0.2 <= dVar21)) {
        uVar16 = uVar16 & 0xffffffef;
      }
      if (uVar14 != 10) goto LAB_0012566d;
      metrics->rans1_cnt = 0;
      metrics->rans1_extra = 0.0;
      uVar14 = 10;
LAB_001256ca:
      if (((iVar10 < iVar18) &&
          (iVar22 = metrics->bzip2_cnt, metrics->bzip2_cnt = iVar22 + 1, 2 < iVar22)) &&
         (dVar21 = (double)iVar18 / (double)iVar10 + -1.0 + metrics->bzip2_extra,
         metrics->bzip2_extra = dVar21, 0.2 <= dVar21)) {
        uVar16 = uVar16 & 0xfffffffb;
      }
      if (uVar14 != 3) goto LAB_00125721;
      metrics->lzma_cnt = 0;
      metrics->lzma_extra = 0.0;
    }
    metrics->revised_method = uVar16;
    __mutex_00 = local_70;
  }
  pthread_mutex_unlock(__mutex_00);
  method_00 = b->method;
LAB_00125777:
  __stream = _stderr;
  if (fd->verbose != 0) {
    uVar16 = b->uncomp_size;
    uVar13 = b->content_id;
    uVar14 = b->comp_size;
    pcVar8 = cram_block_method2str(method_00);
    fprintf(__stream,"Compressed block ID %d from %d to %d by method %s\n",(ulong)uVar13,
            (ulong)uVar16,(ulong)uVar14,pcVar8);
    method_00 = b->method;
  }
  if (method_00 == RANS1) {
    b->method = RANS;
    return 0;
  }
  return 0;
}

Assistant:

int cram_compress_block(cram_fd *fd, cram_block *b, cram_metrics *metrics,
			int method, int level) {

    char *comp = NULL;
    size_t comp_size = 0;
    int strat;

    //fprintf(stderr, "IN: block %d, sz %d\n", b->content_id, b->uncomp_size);

    if (method == RAW || level == 0 || b->uncomp_size == 0) {
	b->method = RAW;
	b->comp_size = b->uncomp_size;
	//fprintf(stderr, "Skip block id %d\n", b->content_id);
	return 0;
    }

    if (metrics) {
	pthread_mutex_lock(&fd->metrics_lock);
	if (metrics->trial > 0 || --metrics->next_trial <= 0) {
	    size_t sz_best = INT_MAX;
	    size_t sz_gz_rle = 0;
	    size_t sz_gz_def = 0;
	    size_t sz_rans0 = 0;
	    size_t sz_rans1 = 0;
	    size_t sz_bzip2 = 0;
	    size_t sz_lzma = 0;
	    int method_best = 0;
	    char *c_best = NULL, *c = NULL;

	    if (metrics->revised_method)
		method = metrics->revised_method;
	    else
		metrics->revised_method = method;

	    if (metrics->next_trial == 0) {
		metrics->next_trial = TRIAL_SPAN;
		metrics->trial = NTRIALS;
		metrics->sz_gz_rle /= 2;
		metrics->sz_gz_def /= 2;
		metrics->sz_rans0  /= 2;
		metrics->sz_rans1  /= 2;
		metrics->sz_bzip2  /= 2;
		metrics->sz_lzma   /= 2;
	    }

	    pthread_mutex_unlock(&fd->metrics_lock);
	    
	    if (method & (1<<GZIP_RLE)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_rle, GZIP, 1, Z_RLE);
		if (c && sz_best > sz_gz_rle) {
		    sz_best = sz_gz_rle;
		    method_best = GZIP_RLE;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_rle = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_rle);
	    }

	    if (method & (1<<GZIP)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_gz_def, GZIP, level,
					    Z_FILTERED);
		if (c && sz_best > sz_gz_def) {
		    sz_best = sz_gz_def;
		    method_best = GZIP;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_gz_def = b->uncomp_size*2+1000;
		}

		//fprintf(stderr, "Block %d; %d->%d\n", b->content_id, b->uncomp_size, sz_gz_def);
	    }

	    if (method & (1<<RANS0)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans0, RANS0, 0, 0);
		if (c && sz_best > sz_rans0) {
		    sz_best = sz_rans0;
		    method_best = RANS0;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans0 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<RANS1)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_rans1, RANS1, 0, 0);
		if (c && sz_best > sz_rans1) {
		    sz_best = sz_rans1;
		    method_best = RANS1;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_rans1 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<BZIP2)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_bzip2, BZIP2, level, 0);
		if (c && sz_best > sz_bzip2) {
		    sz_best = sz_bzip2;
		    method_best = BZIP2;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_bzip2 = b->uncomp_size*2+1000;
		}
	    }

	    if (method & (1<<LZMA)) {
		c = cram_compress_by_method((char *)b->data, b->uncomp_size,
					    &sz_lzma, LZMA, level, 0);
		if (c && sz_best > sz_lzma) {
		    sz_best = sz_lzma;
		    method_best = LZMA;
		    if (c_best)
			free(c_best);
		    c_best = c;
		} else if (c) {
		    free(c);
		} else {
		    sz_lzma = b->uncomp_size*2+1000;
		}
	    }

	    //fprintf(stderr, "sz_best = %d\n", sz_best);

	    free(b->data);
	    b->data = (unsigned char *)c_best;
	    //printf("method_best = %s\n", cram_block_method2str(method_best));
	    b->method = method_best == GZIP_RLE ? GZIP : method_best;
	    b->comp_size = sz_best;

	    pthread_mutex_lock(&fd->metrics_lock);
	    metrics->sz_gz_rle += sz_gz_rle;
	    metrics->sz_gz_def += sz_gz_def;
	    metrics->sz_rans0  += sz_rans0;
	    metrics->sz_rans1  += sz_rans1;
	    metrics->sz_bzip2  += sz_bzip2;
	    metrics->sz_lzma   += sz_lzma;
	    if (--metrics->trial == 0) {
		int best_method = RAW;
		int best_sz = INT_MAX;

		// Scale methods by cost
		if (fd->level <= 3) {
		    metrics->sz_rans1  *= 1.02;
		    metrics->sz_gz_def *= 1.04;
		    metrics->sz_bzip2  *= 1.08;
		    metrics->sz_lzma   *= 1.10;
		} else if (fd->level <= 6) {
		    metrics->sz_rans1  *= 1.01;
		    metrics->sz_gz_def *= 1.02;
		    metrics->sz_bzip2  *= 1.03;
		    metrics->sz_lzma   *= 1.05;
		}

		if (method & (1<<GZIP_RLE) && best_sz > metrics->sz_gz_rle)
		    best_sz = metrics->sz_gz_rle, best_method = GZIP_RLE;

		if (method & (1<<GZIP) && best_sz > metrics->sz_gz_def)
		    best_sz = metrics->sz_gz_def, best_method = GZIP;

		if (method & (1<<RANS0) && best_sz > metrics->sz_rans0)
		    best_sz = metrics->sz_rans0, best_method = RANS0;

		if (method & (1<<RANS1) && best_sz > metrics->sz_rans1)
		    best_sz = metrics->sz_rans1, best_method = RANS1;

		if (method & (1<<BZIP2) && best_sz > metrics->sz_bzip2)
		    best_sz = metrics->sz_bzip2, best_method = BZIP2;

		if (method & (1<<LZMA) && best_sz > metrics->sz_lzma)
		    best_sz = metrics->sz_lzma, best_method = LZMA;

		if (best_method == GZIP_RLE) {
		    metrics->method = GZIP;
		    metrics->strat  = Z_RLE;
		} else {
		    metrics->method = best_method;
		    metrics->strat  = Z_FILTERED;
		}

		// If we see at least MAXFAIL trials in a row for a specific
		// compression method with more than MAXDELTA aggregate
		// size then we drop this from the list of methods used
		// for this block type.
#define MAXDELTA 0.20
#define MAXFAILS 4
		if (best_method == GZIP_RLE) {
		    metrics->gz_rle_cnt = 0;
		    metrics->gz_rle_extra = 0;
		} else if (best_sz < metrics->sz_gz_rle) {
		    double r = (double)metrics->sz_gz_rle / best_sz - 1;
		    if (++metrics->gz_rle_cnt >= MAXFAILS && 
			(metrics->gz_rle_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP_RLE);
		}

		if (best_method == GZIP) {
		    metrics->gz_def_cnt = 0;
		    metrics->gz_def_extra = 0;
		} else if (best_sz < metrics->sz_gz_def) {
		    double r = (double)metrics->sz_gz_def / best_sz - 1;
		    if (++metrics->gz_def_cnt >= MAXFAILS &&
			(metrics->gz_def_extra += r) >= MAXDELTA)
			method &= ~(1<<GZIP);
		}

		if (best_method == RANS0) {
		    metrics->rans0_cnt = 0;
		    metrics->rans0_extra = 0;
		} else if (best_sz < metrics->sz_rans0) {
		    double r = (double)metrics->sz_rans0 / best_sz - 1;
		    if (++metrics->rans0_cnt >= MAXFAILS &&
			(metrics->rans0_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS0);
		}

		if (best_method == RANS1) {
		    metrics->rans1_cnt = 0;
		    metrics->rans1_extra = 0;
		} else if (best_sz < metrics->sz_rans1) {
		    double r = (double)metrics->sz_rans1 / best_sz - 1;
		    if (++metrics->rans1_cnt >= MAXFAILS &&
			(metrics->rans1_extra += r) >= MAXDELTA)
			method &= ~(1<<RANS1);
		}

		if (best_method == BZIP2) {
		    metrics->bzip2_cnt = 0;
		    metrics->bzip2_extra = 0;
		} else if (best_sz < metrics->sz_bzip2) {
		    double r = (double)metrics->sz_bzip2 / best_sz - 1;
		    if (++metrics->bzip2_cnt >= MAXFAILS &&
			(metrics->bzip2_extra += r) >= MAXDELTA)
			method &= ~(1<<BZIP2);
		}

		if (best_method == LZMA) {
		    metrics->lzma_cnt = 0;
		    metrics->lzma_extra = 0;
		} else if (best_sz < metrics->sz_lzma) {
		    double r = (double)metrics->sz_lzma / best_sz - 1;
		    if (++metrics->lzma_cnt >= MAXFAILS &&
			(metrics->lzma_extra += r) >= MAXDELTA)
			method &= ~(1<<LZMA);
		}

		//if (method != metrics->revised_method)
		//    fprintf(stderr, "%d: method from %x to %x\n",
		//	    b->content_id, metrics->revised_method, method);
		metrics->revised_method = method;
	    }
	    pthread_mutex_unlock(&fd->metrics_lock);
	} else {
	    strat = metrics->strat;
	    method = metrics->method;

	    pthread_mutex_unlock(&fd->metrics_lock);
	    comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
					   &comp_size, method,
					   level, strat);
	    if (!comp)
		return -1;
	    free(b->data);
	    b->data = (unsigned char *)comp;
	    b->comp_size = comp_size;
	    b->method = method;
	}

    } else {
	// no cached metrics, so just do zlib?
	comp = cram_compress_by_method((char *)b->data, b->uncomp_size,
				       &comp_size, GZIP, level, Z_FILTERED);
	if (!comp) {
	    fprintf(stderr, "Compression failed!\n");
	    return -1;
	}
	free(b->data);
	b->data = (unsigned char *)comp;
	b->comp_size = comp_size;
	b->method = GZIP;
    }

    if (fd->verbose)
	fprintf(stderr, "Compressed block ID %d from %d to %d by method %s\n",
		b->content_id, b->uncomp_size, b->comp_size,
		cram_block_method2str(b->method));

    if (b->method == RANS1)
	b->method = RANS0; // Spec just has RANS (not 0/1) with auto-sensing

    return 0;
}